

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gamefield.c
# Opt level: O2

void OnUpdateGamefield(Gamefield *gamefield)

{
  long lVar1;
  uint8_t *__ptr;
  ulong uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  size_t x;
  ulong uVar6;
  
  gamefield->simulationStep = gamefield->simulationStep + '\x01';
  lVar5 = 0;
  lVar3 = 0;
  for (uVar2 = 0; uVar2 < gamefield->height; uVar2 = uVar2 + 1) {
    lVar4 = 8;
    for (uVar6 = 0; uVar6 < gamefield->width; uVar6 = uVar6 + 1) {
      lVar1 = (ulong)gamefield->width * lVar5;
      if ((&(gamefield->pixels->color).r)[lVar4 + lVar1] != gamefield->simulationStep) {
        switch(*(undefined4 *)((long)gamefield->pixels + lVar4 + -4 + lVar1)) {
        case 0:
          SandStep(gamefield,(IntVec2)(uVar6 + lVar3));
          break;
        case 1:
          WaterStep(gamefield,(IntVec2)(uVar6 + lVar3));
          break;
        case 5:
          SmokeStep(gamefield,(IntVec2)(uVar6 + lVar3));
          break;
        case 6:
          FireStep(gamefield,(IntVec2)(uVar6 + lVar3));
        }
      }
      lVar4 = lVar4 + 0x14;
    }
    lVar3 = lVar3 + 0x100000000;
    lVar5 = lVar5 + 0x14;
  }
  __ptr = GetRawColor32Array(gamefield);
  (*glad_glTexImage2D)(0xde1,0,0x1908,gamefield->width,gamefield->height,0,0x1908,0x1401,__ptr);
  free(__ptr);
  return;
}

Assistant:

void OnUpdateGamefield(Gamefield* gamefield) {
    gamefield->simulationStep += 1;
    for (size_t y = 0; y < gamefield->height; y++) {
        for (size_t x = 0; x < gamefield->width; x++) {
            if (gamefield->pixels[y * gamefield->width + x].lastUpdatedFrameNumber == gamefield->simulationStep) continue;
            IntVec2 coords;
            coords.x = x;
            coords.y = y;
            if (gamefield->pixels[y * gamefield->width + x].pixelType == Sand) {
                SandStep(gamefield, coords);
            }
            else if (gamefield->pixels[y * gamefield->width + x].pixelType == Water) {
                WaterStep(gamefield, coords);
            }
            else if (gamefield->pixels[y * gamefield->width + x].pixelType == Smoke) {
                SmokeStep(gamefield, coords);
            }
            else if (gamefield->pixels[y * gamefield->width + x].pixelType == Fire) {
                FireStep(gamefield, coords);
            }
        }
    }

    uint8_t* rawPixelArray = NULL;
    if (rawPixelArray == NULL) {
        rawPixelArray = GetRawColor32Array(gamefield);
    }
    glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA, gamefield->width, gamefield->height, 0, GL_RGBA, GL_UNSIGNED_BYTE, rawPixelArray);
    free(rawPixelArray);
}